

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

void prsxsend(prscxdef *ctx)

{
  ushort uVar1;
  size_t sVar2;
  long in_RDI;
  uchar *str;
  ushort rounded;
  ushort siz;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  ushort uVar3;
  
  uVar3 = *(ushort *)(in_RDI + 0x9c);
  oswp2((void *)(in_RDI + 0xd0 + (ulong)*(uint *)(in_RDI + 0x98)),(uint)uVar3);
  if (*(long *)(in_RDI + 200) != 0) {
    in_stack_ffffffffffffffe8 = (char *)(in_RDI + (ulong)*(uint *)(in_RDI + 0x98) + 0xd2);
    in_stack_ffffffffffffffe8[(int)(uVar3 - 2)] = '\0';
    fputs(in_stack_ffffffffffffffe8,*(FILE **)(in_RDI + 200));
    fputs("\n",*(FILE **)(in_RDI + 200));
  }
  sVar2 = osrndsz((ulong)uVar3);
  if ((ushort)sVar2 != uVar3) {
    uVar1 = (ushort)sVar2 - uVar3;
    if (*(ushort *)(in_RDI + 0xa0) < uVar1) {
      errsigf((errcxdef *)CONCAT26(uVar3,CONCAT24(uVar1,in_stack_fffffffffffffff0)),
              in_stack_ffffffffffffffe8,0);
    }
    *(long *)(in_RDI + 0x90) = *(long *)(in_RDI + 0x90) + (long)(int)(uint)uVar1;
    *(ushort *)(in_RDI + 0xa0) = *(short *)(in_RDI + 0xa0) - uVar1;
  }
  return;
}

Assistant:

void prsxsend(prscxdef *ctx)
{
    ushort siz;
    ushort rounded;
    
    /* figure total size of string, including padding for alignment */
    siz = ctx->prscxslen;
    
    /* write length at beginning of string */
    oswp2(&ctx->prscxpool[ctx->prscxsofs], siz);
    
    /* if desired, write the string to the strings file */
    if (ctx->prscxstrfile != 0)
    {
        uchar *str;

        str = &ctx->prscxpool[ctx->prscxsofs] + 2;
        str[siz - 2] = '\0';
        osfputs((char *)str, ctx->prscxstrfile);
        osfputs("\n", ctx->prscxstrfile);
    }

    /* round size of string if necessary */
    rounded = osrndsz(siz);
    if (rounded - siz)
    {
        rounded -= siz;
        if (ctx->prscxnrem < rounded)
            errsig(ctx->prscxerr, ERR_NONODE);
        ctx->prscxnode += rounded;
        ctx->prscxnrem -= rounded;
    }
}